

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateNoCompression(ucvector *out,uchar *in,size_t *bp,size_t *pos,size_t inlength)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  uint error;
  uint n;
  uint NLEN;
  uint LEN;
  size_t p;
  uint in_stack_ffffffffffffffbc;
  undefined8 local_38;
  undefined4 local_4;
  
  local_4 = 0;
  while ((*in_RDX & 7) != 0) {
    *in_RDX = *in_RDX + 1;
  }
  uVar6 = *in_RDX >> 3;
  if (uVar6 + 4 < in_R8) {
    uVar4 = (uint)*(byte *)(in_RSI + uVar6) + (uint)*(byte *)(in_RSI + 1 + uVar6) * 0x100;
    if (uVar4 + (uint)*(byte *)(in_RSI + uVar6 + 2) +
                (uint)*(byte *)(in_RSI + 1 + uVar6 + 2) * 0x100 == 0xffff) {
      uVar5 = ucvector_resize((ucvector *)((ulong)in_stack_ffffffffffffffbc << 0x20),0x122702);
      if (uVar5 == 0) {
        local_4 = 0x53;
      }
      else if (in_R8 < uVar6 + 4 + (ulong)uVar4) {
        local_4 = 0x17;
      }
      else {
        local_38 = uVar6 + 4;
        for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
          uVar1 = *(undefined1 *)(in_RSI + local_38);
          lVar2 = *in_RDI;
          lVar3 = *in_RCX;
          *in_RCX = lVar3 + 1;
          *(undefined1 *)(lVar2 + lVar3) = uVar1;
          local_38 = local_38 + 1;
        }
        *in_RDX = local_38 << 3;
      }
    }
    else {
      local_4 = 0x15;
    }
  }
  else {
    local_4 = 0x34;
  }
  return local_4;
}

Assistant:

static unsigned inflateNoCompression(ucvector* out, const unsigned char* in, size_t* bp, size_t* pos, size_t inlength)
{
	size_t p;
	unsigned LEN, NLEN, n, error = 0;

	/*go to first boundary of byte*/
	while (((*bp) & 0x7) != 0) ++(*bp);
	p = (*bp) / 8; /*byte position*/

	/*read LEN (2 bytes) and NLEN (2 bytes)*/
	if (p + 4 >= inlength) return 52; /*error, bit pointer will jump past memory*/
	LEN = in[p] + 256u * in[p + 1]; p += 2;
	NLEN = in[p] + 256u * in[p + 1]; p += 2;

	/*check if 16-bit NLEN is really the one's complement of LEN*/
	if (LEN + NLEN != 65535) return 21; /*error: NLEN is not one's complement of LEN*/

	if (!ucvector_resize(out, (*pos) + LEN)) return 83; /*alloc fail*/

	/*read the literal data: LEN bytes are now stored in the out buffer*/
	if (p + LEN > inlength) return 23; /*error: reading outside of in buffer*/
	for (n = 0; n < LEN; ++n) out->data[(*pos)++] = in[p++];

	(*bp) = p * 8;

	return error;
}